

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::ConsoleReporter::test_case_exception
          (ConsoleReporter *this,TestCaseException *e)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  long in_RSI;
  long *in_RDI;
  int i;
  String *stringified_contexts;
  int num_stringified_contexts;
  lock_guard<std::mutex> lock;
  undefined4 in_stack_ffffffffffffff68;
  Enum in_stack_ffffffffffffff6c;
  ostream *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  ConsoleReporter *in_stack_ffffffffffffff90;
  ConsoleReporter *in_stack_ffffffffffffffa0;
  int local_3c;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff70,
             (mutex_type *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if ((*(byte *)(in_RDI[0xd] + 0x3a) & 1) == 0) {
    logTestStart(in_stack_ffffffffffffffa0);
    pcVar2 = String::c_str((String *)0x181e3b);
    (**(code **)(*in_RDI + 0x70))(in_RDI,pcVar2,*(undefined4 *)(in_RDI[0xd] + 0x18)," ");
    successOrFailColoredStringToStream
              (in_stack_ffffffffffffff90,SUB81((ulong)in_stack_ffffffffffffff88 >> 0x38,0),
               (Enum)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    poVar3 = Color::operator<<(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    pcVar2 = "test case THREW exception: ";
    if ((*(byte *)(in_RSI + 0x18) & 1) != 0) {
      pcVar2 = "test case CRASHED: ";
    }
    std::operator<<(poVar3,pcVar2);
    Color::operator<<(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    poVar3 = doctest::operator<<(in_stack_ffffffffffffff70,
                                 (String *)
                                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    std::operator<<(poVar3,"\n");
    iVar1 = IReporter::get_num_stringified_contexts();
    if (iVar1 != 0) {
      IReporter::get_stringified_contexts();
      poVar3 = Color::operator<<(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
      std::operator<<(poVar3,"  logged: ");
      for (local_3c = iVar1; 0 < local_3c; local_3c = local_3c + -1) {
        pcVar2 = "          ";
        if (local_3c == iVar1) {
          pcVar2 = "";
        }
        std::operator<<((ostream *)in_RDI[1],pcVar2);
        poVar3 = doctest::operator<<(in_stack_ffffffffffffff70,
                                     (String *)
                                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        std::operator<<(poVar3,"\n");
      }
    }
    poVar3 = std::operator<<((ostream *)in_RDI[1],"\n");
    Color::operator<<(poVar3,in_stack_ffffffffffffff6c);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x182055);
  return;
}

Assistant:

void test_case_exception(const TestCaseException& e) override {
            std::lock_guard<std::mutex> lock(mutex);
            if(tc->m_no_output)
                return;

            logTestStart();

            file_line_to_stream(tc->m_file.c_str(), tc->m_line, " ");
            successOrFailColoredStringToStream(false, e.is_crash ? assertType::is_require :
                                                                   assertType::is_check);
            s << Color::Red << (e.is_crash ? "test case CRASHED: " : "test case THREW exception: ")
              << Color::Cyan << e.error_string << "\n";

            int num_stringified_contexts = get_num_stringified_contexts();
            if(num_stringified_contexts) {
                auto stringified_contexts = get_stringified_contexts();
                s << Color::None << "  logged: ";
                for(int i = num_stringified_contexts; i > 0; --i) {
                    s << (i == num_stringified_contexts ? "" : "          ")
                      << stringified_contexts[i - 1] << "\n";
                }
            }
            s << "\n" << Color::None;
        }